

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

bool __thiscall
ThreadedReplayer::run_creation_work_item_setup_graphics
          (ThreadedReplayer *this,PipelineWorkItem *work_item)

{
  uint uVar1;
  pointer pPVar2;
  VkGraphicsPipelineCreateInfo *info;
  bool bVar3;
  char *__ptr;
  long in_FS_OFFSET;
  size_t sStack_20;
  
  uVar1 = *(uint *)(in_FS_OFFSET + -0x18);
  pPVar2 = (this->per_thread_data).
           super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2[uVar1].current_graphics_index = work_item->index + 1;
  pPVar2[uVar1].current_graphics_pipeline = work_item->hash;
  info = (work_item->create_info).graphics_create_info;
  if (info == (VkGraphicsPipelineCreateInfo *)0x0) {
    __ptr = "Fossilize ERROR: Invalid graphics create info.\n";
    sStack_20 = 0x2f;
  }
  else {
    if (((info->flags & 4) == 0) || (info->basePipelineHandle != (VkPipeline)0x0)) {
      bVar3 = Fossilize::FeatureFilter::graphics_pipeline_is_supported
                        (&((this->device)._M_t.
                           super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                           .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                          feature_filter,info);
      if (bVar3) {
        mark_currently_active_modules
                  (this,((work_item->create_info).graphics_create_info)->pStages,
                   ((work_item->create_info).graphics_create_info)->stageCount);
        return true;
      }
      fprintf(_stderr,
              "Fossilize WARN: Graphics pipeline %016lx is not supported by current device, skipping.\n"
              ,work_item->hash);
      fflush(_stderr);
      return false;
    }
    __ptr = "Fossilize ERROR: Invalid derivative pipeline!\n";
    sStack_20 = 0x2e;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  fflush(_stderr);
  return false;
}

Assistant:

bool run_creation_work_item_setup_graphics(const PipelineWorkItem &work_item)
	{
		auto &per_thread = get_per_thread_data();
		per_thread.current_graphics_index = work_item.index + 1;
		per_thread.current_graphics_pipeline = work_item.hash;

		if (!work_item.create_info.graphics_create_info)
		{
			LOGE("Invalid graphics create info.\n");
			return false;
		}

		if ((work_item.create_info.graphics_create_info->flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
		    work_item.create_info.graphics_create_info->basePipelineHandle == VK_NULL_HANDLE)
		{
			// This pipeline failed for some reason, don't try to compile this one either.
			LOGE("Invalid derivative pipeline!\n");
			return false;
		}

		if (!device->get_feature_filter().graphics_pipeline_is_supported(work_item.create_info.graphics_create_info))
		{
			LOGW("Graphics pipeline %016" PRIx64 " is not supported by current device, skipping.\n", work_item.hash);
			return false;
		}

		mark_currently_active_modules(work_item.create_info.graphics_create_info->pStages,
		                              work_item.create_info.graphics_create_info->stageCount);

		return true;
	}